

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

TxOut * __thiscall
cfd::core::Psbt::GetTxInUtxo
          (TxOut *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool *is_witness)

{
  long lVar1;
  CfdException *this_00;
  allocator local_139;
  string local_138;
  CfdSourceLocation local_118;
  ByteData local_100;
  Script local_e8;
  Amount local_b0;
  uint local_a0;
  uint32_t vout;
  ByteData local_90;
  Script local_78;
  Amount local_40;
  void *local_30;
  wally_psbt *psbt_pointer;
  bool *is_witness_local;
  bool ignore_error_local;
  Psbt *pPStack_18;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)is_witness;
  is_witness_local._3_1_ = ignore_error;
  is_witness_local._4_4_ = index;
  pPStack_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa13,"GetTxInUtxo");
  local_30 = this->wally_psbt_pointer_;
  if (*(long *)(*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110 + 8) == 0)
  {
    if (*(long *)(*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110) == 0) {
      if ((is_witness_local._3_1_ & 1) == 0) {
        local_118.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_118.filename = local_118.filename + 1;
        local_118.line = 0xa2f;
        local_118.funcname = "GetTxInUtxo";
        logger::warn<>(&local_118,"utxo not found.");
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_138,"psbt utxo not found error.",&local_139)
        ;
        CfdException::CfdException(this_00,kCfdIllegalStateError,&local_138);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      TxOut::TxOut(__return_storage_ptr__);
    }
    else {
      if (psbt_pointer != (wally_psbt *)0x0) {
        psbt_pointer->magic[0] =
             *(long *)(*(long *)((long)local_30 + 0x10) + (ulong)is_witness_local._4_4_ * 0x110 + 8)
             != 0;
      }
      local_a0 = *(uint *)(*(long *)(*(long *)((long)local_30 + 8) + 8) + 0x20 +
                          (ulong)is_witness_local._4_4_ * 0xd0);
      Amount::Amount(&local_b0,
                     *(int64_t *)
                      (*(long *)(*(long *)(*(long *)((long)local_30 + 0x10) +
                                          (ulong)is_witness_local._4_4_ * 0x110) + 0x20) +
                      (ulong)local_a0 * 0x70));
      lVar1 = *(long *)(*(long *)(*(long *)((long)local_30 + 0x10) +
                                 (ulong)is_witness_local._4_4_ * 0x110) + 0x20);
      ByteData::ByteData(&local_100,*(uint8_t **)(lVar1 + 8 + (ulong)local_a0 * 0x70),
                         *(uint32_t *)(lVar1 + 0x10 + (ulong)local_a0 * 0x70));
      Script::Script(&local_e8,&local_100);
      TxOut::TxOut(__return_storage_ptr__,&local_b0,&local_e8);
      Script::~Script(&local_e8);
      ByteData::~ByteData(&local_100);
    }
  }
  else {
    if (psbt_pointer != (wally_psbt *)0x0) {
      psbt_pointer->magic[0] = '\x01';
    }
    Amount::Amount(&local_40,
                   **(int64_t **)
                     (*(long *)((long)local_30 + 0x10) + 8 + (ulong)is_witness_local._4_4_ * 0x110))
    ;
    lVar1 = *(long *)(*(long *)((long)local_30 + 0x10) + 8 + (ulong)is_witness_local._4_4_ * 0x110);
    ByteData::ByteData(&local_90,*(uint8_t **)(lVar1 + 8),*(uint32_t *)(lVar1 + 0x10));
    Script::Script(&local_78,&local_90);
    TxOut::TxOut(__return_storage_ptr__,&local_40,&local_78);
    Script::~Script(&local_78);
    ByteData::~ByteData(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

TxOut Psbt::GetTxInUtxo(
    uint32_t index, bool ignore_error, bool *is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
    if (is_witness != nullptr) *is_witness = true;
    return TxOut(
        Amount(static_cast<int64_t>(
            psbt_pointer->inputs[index].witness_utxo->satoshi)),
        Script(ByteData(
            psbt_pointer->inputs[index].witness_utxo->script,
            static_cast<uint32_t>(
                psbt_pointer->inputs[index].witness_utxo->script_len))));
  } else if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (is_witness != nullptr) {
      *is_witness = (psbt_pointer->inputs[index].witness_utxo != nullptr);
    }
    uint32_t vout = psbt_pointer->tx->inputs[index].index;
    return TxOut(
        Amount(static_cast<int64_t>(
            psbt_pointer->inputs[index].utxo->outputs[vout].satoshi)),
        Script(ByteData(
            psbt_pointer->inputs[index].utxo->outputs[vout].script,
            static_cast<uint32_t>(
                psbt_pointer->inputs[index].utxo->outputs[vout].script_len))));
  } else if (ignore_error) {
    return TxOut();
  } else {
    warn(CFD_LOG_SOURCE, "utxo not found.");
    throw CfdException(kCfdIllegalStateError, "psbt utxo not found error.");
  }
}